

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wchar_t * fmt::v5::internal::
          parse_arg_id<wchar_t,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,fmt::v5::internal::error_handler>>>&,wchar_t>>
                    (wchar_t *begin,wchar_t *end,
                    precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>_>_&,_wchar_t>
                    *handler)

{
  long lVar1;
  wchar_t *pwVar2;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>_>
  *psVar3;
  basic_parse_context<wchar_t,_fmt::v5::internal::error_handler> *pbVar4;
  dynamic_format_specs<wchar_t> *pdVar5;
  wchar_t wVar6;
  long lVar7;
  uint uVar8;
  
  wVar6 = *begin;
  if ((wVar6 == L'}') || (wVar6 == L':')) {
    psVar3 = handler->handler;
    pbVar4 = (psVar3->
             super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
             ).context_;
    uVar8 = pbVar4->next_arg_id_;
    if ((int)uVar8 < 0) {
      error_handler::on_error
                ((error_handler *)pbVar4,"cannot switch from manual to automatic argument indexing")
      ;
      uVar8 = 0;
    }
    else {
      pbVar4->next_arg_id_ = uVar8 + 1;
    }
    pdVar5 = (psVar3->
             super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
             ).specs_;
    (pdVar5->precision_ref).kind = INDEX;
    (pdVar5->precision_ref).field_1.index = uVar8;
  }
  else {
    if ((uint)(wVar6 + L'\xffffffd0') < 10) {
      begin = begin + 1;
      uVar8 = 0;
      pwVar2 = begin;
      if (wVar6 != L'0') {
        do {
          begin = pwVar2;
          if (0xccccccc < uVar8) {
            begin = begin + -1;
            uVar8 = 0x80000000;
            goto LAB_0013e6cf;
          }
          uVar8 = (wVar6 + uVar8 * 10) - 0x30;
          if (begin == end) break;
          wVar6 = *begin;
          pwVar2 = begin + 1;
        } while ((uint)(wVar6 + L'\xffffffd0') < 10);
        if ((int)uVar8 < 0) {
LAB_0013e6cf:
          error_handler::on_error
                    ((error_handler *)
                     (handler->handler->
                     super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
                     ).context_,"number is too big");
        }
      }
      if ((begin != end) && ((*begin == L':' || (*begin == L'}')))) {
        psVar3 = handler->handler;
        pbVar4 = (psVar3->
                 super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
                 ).context_;
        if (pbVar4->next_arg_id_ < 1) {
          pbVar4->next_arg_id_ = -1;
        }
        else {
          error_handler::on_error
                    ((error_handler *)pbVar4,
                     "cannot switch from automatic to manual argument indexing");
        }
        pdVar5 = (psVar3->
                 super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
                 ).specs_;
        (pdVar5->precision_ref).kind = INDEX;
        (pdVar5->precision_ref).field_1.index = uVar8;
        return begin;
      }
    }
    else if ((wVar6 == L'_') || ((uint)((wVar6 & 0xffffffdfU) - 0x41U) < 0x1a)) {
      lVar1 = 4;
      do {
        lVar7 = lVar1;
        pwVar2 = (wchar_t *)((long)begin + lVar7);
        if (pwVar2 == end) break;
        wVar6 = *pwVar2;
        lVar1 = lVar7 + 4;
      } while ((((uint)(wVar6 + L'\xffffffd0') < 10) || (wVar6 == L'_')) ||
              ((uint)((wVar6 & 0xffffffdfU) - 0x41U) < 0x1a));
      pdVar5 = (handler->handler->
               super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
               ).specs_;
      (pdVar5->precision_ref).kind = NAME;
      (pdVar5->precision_ref).field_1.name.value = begin;
      (pdVar5->precision_ref).field_1.name.size = lVar7 >> 2;
      return pwVar2;
    }
    error_handler::on_error
              ((error_handler *)
               (handler->handler->
               super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
               ).context_,"invalid format string");
  }
  return begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}